

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O2

void lower_named_interface_blocks(void *mem_ctx,gl_linked_shader *shader)

{
  undefined1 *puVar1;
  uint uVar2;
  exec_list *l;
  exec_node *peVar3;
  exec_node *peVar4;
  bool bVar5;
  exec_node *peVar6;
  glsl_type *pgVar7;
  char *pcVar8;
  hash_entry *phVar9;
  char *name;
  glsl_type *type;
  ir_variable *piVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ir_variable *piVar18;
  ulong uVar19;
  long lVar20;
  ir_variable *this;
  exec_node *peVar21;
  ir_hierarchical_visitor local_78;
  void *local_40;
  hash_table *local_38;
  
  ir_rvalue_visitor::ir_rvalue_visitor((ir_rvalue_visitor *)&local_78);
  local_78._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_00250978;
  local_38 = (hash_table *)0x0;
  l = shader->ir;
  local_40 = mem_ctx;
  local_38 = _mesa_hash_table_create((void *)0x0,_mesa_hash_string,_mesa_key_string_equal);
  peVar3 = (l->head_sentinel).next;
  peVar6 = peVar3->next;
  this = (ir_variable *)0x0;
  piVar10 = (ir_variable *)0x0;
  if (peVar6 == (exec_node *)0x0) goto LAB_00174ded;
  this = (ir_variable *)&peVar3[-1].prev;
  do {
    piVar10 = (ir_variable *)&peVar6[-1].prev;
    if (peVar6->next == (exec_node *)0x0) {
      piVar10 = (ir_variable *)0x0;
    }
LAB_00174ded:
    do {
      piVar18 = piVar10;
      if (this == (ir_variable *)0x0) {
        visit_list_elements(&local_78,l,true);
        _mesa_hash_table_destroy(local_38,(_func_void_hash_entry_ptr *)0x0);
        return;
      }
      if ((((this->super_ir_instruction).ir_type == ir_type_variable) &&
          (bVar5 = ir_variable::is_interface_instance(this), bVar5)) &&
         (1 < (*(uint *)&this->data >> 0xc & 0xf) - 1)) {
        pgVar7 = glsl_type::without_array(this->type);
        if (pgVar7->field_0x4 != '\x10') {
          __assert_fail("iface_t->is_interface()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                        ,0x99,
                        "void (anonymous namespace)::flatten_named_interface_blocks_declarations::run(exec_list *)"
                       );
        }
        peVar3 = &(this->super_ir_instruction).super_exec_node;
        lVar20 = 0;
        peVar6 = peVar3;
        for (uVar19 = 0; uVar19 < pgVar7->length; uVar19 = uVar19 + 1) {
          pcVar8 = " out";
          if (((undefined1  [44])this->data & (undefined1  [44])0xf000) == (undefined1  [44])0x4000)
          {
            pcVar8 = " in";
          }
          pcVar8 = ralloc_asprintf(local_40,"%s %s.%s.%s",pcVar8 + 1,pgVar7->name,this->name,
                                   *(undefined8 *)
                                    (&((pgVar7->fields).array)->vector_elements + lVar20));
          phVar9 = _mesa_hash_table_search(local_38,pcVar8);
          if ((phVar9 == (hash_entry *)0x0) || (peVar21 = peVar6, phVar9->data == (void *)0x0)) {
            name = ralloc_strdup(local_40,*(char **)(&((pgVar7->fields).array)->vector_elements +
                                                    lVar20));
            if (this->type->field_0x4 == '\x11') {
              type = process_array_type(this->type,(uint)uVar19);
              piVar10 = (ir_variable *)exec_node::operator_new(0x90,local_40);
              uVar2 = *(uint *)&this->data;
            }
            else {
              piVar10 = (ir_variable *)exec_node::operator_new(0x90,local_40);
              type = *(glsl_type **)((long)&((pgVar7->fields).array)->gl_type + lVar20);
              uVar2 = *(uint *)&this->data;
            }
            ir_variable::ir_variable
                      (piVar10,type,name,uVar2 >> 0xc & (ir_var_mode_count|ir_var_shader_shared));
            uVar2 = *(uint *)((long)&((pgVar7->fields).array)->name + lVar20);
            (piVar10->data).location = uVar2;
            uVar11 = ~uVar2 >> 0xd & 0x40000;
            uVar2 = *(uint *)&piVar10->data;
            *(uint *)&piVar10->data = uVar2 & 0xfffbffff | uVar11;
            (piVar10->data).offset = *(uint *)((long)&((pgVar7->fields).array)->name + lVar20 + 4);
            uVar12 = ~*(uint *)((long)&((pgVar7->fields).array)->name + lVar20 + 4) >> 4 & 0x8000000
            ;
            *(uint *)&piVar10->data = uVar2 & 0xf7fbffff | uVar11 | uVar12;
            (piVar10->data).xfb_buffer =
                 *(uint *)((long)&((pgVar7->fields).array)->explicit_stride + lVar20);
            uVar13 = (*(byte *)((long)&((pgVar7->fields).array)->mem_ctx + lVar20) & 1) << 0x1a;
            *(uint *)&piVar10->data = uVar2 & 0xf3fbffff | uVar11 | uVar12 | uVar13;
            uVar14 = (*(ushort *)((long)&((pgVar7->fields).array)->fields + lVar20) & 3) << 0x10;
            *(uint *)&piVar10->data = uVar2 & 0xf3f8ffff | uVar11 | uVar12 | uVar13 | uVar14;
            uVar15 = *(uint *)((long)&((pgVar7->fields).array)->fields + lVar20) >> 2 & 2;
            *(uint *)&piVar10->data =
                 uVar2 & 0xf3f8fffd | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
            uVar16 = *(uint *)((long)&((pgVar7->fields).array)->fields + lVar20) >> 2 & 4;
            *(uint *)&piVar10->data =
                 uVar2 & 0xf3f8fff9 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16;
            uVar17 = *(uint *)((long)&((pgVar7->fields).array)->fields + lVar20) >> 4 & 8;
            *(uint *)&piVar10->data =
                 uVar2 & 0xf3f8fff1 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17;
            (piVar10->data).stream = (this->data).stream;
            *(uint *)&piVar10->data =
                 uVar2 & 0xf3f8f3f1 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17 |
                 *(uint *)&this->data & 0xc00;
            puVar1 = &(piVar10->data).field_0x4;
            *puVar1 = *puVar1 | 4;
            ir_variable::init_interface_type(piVar10,this->type);
            _mesa_hash_table_insert(local_38,pcVar8,piVar10);
            peVar21 = &(piVar10->super_ir_instruction).super_exec_node;
            peVar4 = peVar6->next;
            (piVar10->super_ir_instruction).super_exec_node.next = peVar4;
            (piVar10->super_ir_instruction).super_exec_node.prev = peVar6;
            peVar4->prev = peVar21;
            peVar6->next = peVar21;
          }
          lVar20 = lVar20 + 0x30;
          peVar6 = peVar21;
        }
        peVar6 = (this->super_ir_instruction).super_exec_node.next;
        peVar21 = (this->super_ir_instruction).super_exec_node.prev;
        peVar6->prev = peVar21;
        peVar21->next = peVar6;
        peVar3->next = (exec_node *)0x0;
        (this->super_ir_instruction).super_exec_node.prev = (exec_node *)0x0;
      }
      piVar10 = (ir_variable *)0x0;
      this = piVar18;
    } while (piVar18 == (ir_variable *)0x0);
    peVar6 = (piVar18->super_ir_instruction).super_exec_node.next;
  } while( true );
}

Assistant:

void
lower_named_interface_blocks(void *mem_ctx, gl_linked_shader *shader)
{
   flatten_named_interface_blocks_declarations v_decl(mem_ctx);
   v_decl.run(shader->ir);
}